

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::removeScaleFactorsByPartition
          (BeagleCPUImpl<double,_2,_0> *this,int *scalingIndices,int count,
          int cumulativeScalingIndex,int partitionIndex)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  double dVar5;
  int j;
  double *scaleBuffer;
  int i;
  double *cumulativeScaleBuffer;
  int endPattern;
  int startPattern;
  undefined4 local_44;
  undefined4 local_34;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 0x90) + (long)in_R8D * 4);
  iVar2 = *(int *)(*(long *)(in_RDI + 0x90) + (long)(in_R8D + 1) * 4);
  lVar3 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)in_ECX * 8);
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    lVar4 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)*(int *)(in_RSI + (long)local_34 * 4) * 8);
    for (local_44 = iVar1; local_44 < iVar2; local_44 = local_44 + 1) {
      if ((*(ulong *)(in_RDI + 0x58) & 0x400) == 0) {
        dVar5 = log(*(double *)(lVar4 + (long)local_44 * 8));
        *(double *)(lVar3 + (long)local_44 * 8) = *(double *)(lVar3 + (long)local_44 * 8) - dVar5;
      }
      else {
        *(double *)(lVar3 + (long)local_44 * 8) =
             *(double *)(lVar3 + (long)local_44 * 8) - *(double *)(lVar4 + (long)local_44 * 8);
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::removeScaleFactorsByPartition(const int* scalingIndices,
                                                                     int count,
                                                                     int cumulativeScalingIndex,
                                                                     int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
    for(int i=0; i<count; i++) {
        const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
        for(int j=startPattern; j<endPattern; j++) {
            if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                cumulativeScaleBuffer[j] -= scaleBuffer[j];
            else
                cumulativeScaleBuffer[j] -= log(scaleBuffer[j]);
        }
    }

    return BEAGLE_SUCCESS;
}